

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O3

void fiowrtsym(void *ctx0,toksdef *t)

{
  errcxdef *ctx;
  FILE *__s;
  uint16_t tmp;
  size_t sVar1;
  ulong __n;
  uchar buf [89];
  byte local_78;
  uchar local_77;
  ushort local_76;
  undefined1 local_74 [92];
  
  ctx = *(errcxdef **)((long)ctx0 + 8);
  __s = *(FILE **)((long)ctx0 + 0x10);
  local_78 = t->tokslen;
  __n = (ulong)local_78;
  local_77 = t->tokstyp;
  local_76 = t->toksval;
  memcpy(local_74,t->toksnam,__n);
  sVar1 = fwrite(&local_78,__n + 4,1,__s);
  if (sVar1 == 1) {
    return;
  }
  errsigf(ctx,"TADS",0x259);
}

Assistant:

static void fiowrtsym(void *ctx0, toksdef *t)
{
    fiowcxdef  *ctx = (fiowcxdef *)ctx0;
    uchar       buf[TOKNAMMAX + 50];
    errcxdef   *ec = ctx->fiowcxerr;
    osfildef   *fp = ctx->fiowcxfp;

    buf[0] = t->tokslen;
    buf[1] = t->tokstyp;
    oswp2(buf + 2, t->toksval);
    memcpy(buf + 4, t->toksnam, (size_t)buf[0]);
    if (osfwb(fp, buf, 4 + t->tokslen)) errsig(ec, ERR_WRTGAM);
}